

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  key_type kVar12;
  value_type vVar13;
  size_type in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  value_type in_stack_fffffffffffff930;
  value_type in_stack_fffffffffffff934;
  undefined2 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff942;
  undefined1 in_stack_fffffffffffff943;
  undefined4 in_stack_fffffffffffff944;
  undefined4 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94c;
  undefined1 in_stack_fffffffffffff94d;
  undefined1 in_stack_fffffffffffff94e;
  undefined1 in_stack_fffffffffffff94f;
  undefined4 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff954;
  undefined1 in_stack_fffffffffffff955;
  undefined1 in_stack_fffffffffffff956;
  undefined1 in_stack_fffffffffffff957;
  Type type;
  undefined4 in_stack_fffffffffffff960;
  uint i_00;
  string local_678 [8];
  char *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  AssertionResult *in_stack_fffffffffffff9a8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b0;
  AssertionResult local_640 [3];
  value_type local_608;
  int local_604;
  value_type local_5d8;
  int local_5d4;
  string local_5d0 [55];
  undefined1 local_599;
  AssertionResult local_598 [3];
  value_type local_55c;
  string local_558 [55];
  byte local_521;
  AssertionResult local_520;
  string local_510 [55];
  undefined1 local_4d9;
  AssertionResult local_4d8 [3];
  value_type local_49c;
  string local_498 [55];
  byte local_461;
  AssertionResult local_460;
  string local_450 [55];
  undefined1 local_419;
  AssertionResult local_418 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_388;
  Hasher local_374;
  string local_368 [55];
  undefined1 local_331;
  AssertionResult local_330;
  string local_320 [55];
  byte local_2e9;
  AssertionResult local_2e8;
  string local_2d8 [55];
  undefined1 local_2a1;
  AssertionResult local_2a0;
  key_type local_28c;
  string local_288 [55];
  byte local_251;
  AssertionResult local_250;
  string local_240 [55];
  undefined1 local_209;
  AssertionResult local_208;
  string local_1f8 [55];
  byte local_1c1;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_168;
  Hasher local_158;
  Hasher local_14c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  i_00 = 0;
  Hasher::Hasher(local_94,0);
  Hasher::Hasher(&local_a0,i_00);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,i_00,(int *)(ulong)i_00);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff960),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,
                               CONCAT15(in_stack_fffffffffffff955,
                                        CONCAT14(in_stack_fffffffffffff954,in_stack_fffffffffffff950
                                                )))),
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff94f,
                      CONCAT16(in_stack_fffffffffffff94e,
                               CONCAT15(in_stack_fffffffffffff94d,
                                        CONCAT14(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                )))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff944,
                      CONCAT13(in_stack_fffffffffffff943,
                               CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  Hasher::Hasher(local_14c,0);
  Hasher::Hasher(&local_158,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_168,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff960),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,
                               CONCAT15(in_stack_fffffffffffff955,
                                        CONCAT14(in_stack_fffffffffffff954,in_stack_fffffffffffff950
                                                )))),
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff94f,
                      CONCAT16(in_stack_fffffffffffff94e,
                               CONCAT15(in_stack_fffffffffffff94d,
                                        CONCAT14(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                )))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff944,
                      CONCAT13(in_stack_fffffffffffff943,
                               CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_168);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_179 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedb1a0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff956,
                                               CONCAT15(in_stack_fffffffffffff955,
                                                        CONCAT14(in_stack_fffffffffffff954,
                                                                 in_stack_fffffffffffff950)))),
               CONCAT13(in_stack_fffffffffffff94f,
                        CONCAT12(in_stack_fffffffffffff94e,
                                 CONCAT11(in_stack_fffffffffffff94d,in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_1b0);
    testing::Message::~Message((Message *)0xedb2e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedb378);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_1c1 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedb3b6)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff955,
                                                              CONCAT14(in_stack_fffffffffffff954,
                                                                       in_stack_fffffffffffff950))))
               ,CONCAT13(in_stack_fffffffffffff94f,
                         CONCAT12(in_stack_fffffffffffff94e,
                                  CONCAT11(in_stack_fffffffffffff94d,in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_1f8);
    testing::Message::~Message((Message *)0xedb48b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedb51f);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_209 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedb560)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff954,
                                                  in_stack_fffffffffffff950)))),
               CONCAT13(in_stack_fffffffffffff94f,
                        CONCAT12(in_stack_fffffffffffff94e,
                                 CONCAT11(in_stack_fffffffffffff94d,in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_240);
    testing::Message::~Message((Message *)0xedb635);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedb6c9);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_251 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedb70c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_250);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff950)))),
               CONCAT13(in_stack_fffffffffffff94f,
                        CONCAT12(in_stack_fffffffffffff94e,
                                 CONCAT11(in_stack_fffffffffffff94d,in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_288);
    testing::Message::~Message((Message *)0xedb7e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedb878);
  kVar12 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       in_stack_fffffffffffff92c);
  local_28c = kVar12;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                    (key_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  uVar6 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_2a1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedb8f0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffff94e,
                                       CONCAT11(in_stack_fffffffffffff94d,in_stack_fffffffffffff94c)
                                      )),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_2d8);
    testing::Message::~Message((Message *)0xedb9c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedba59);
  uVar7 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_2e9 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedba9c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffff94d,
                                                      in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_320);
    testing::Message::~Message((Message *)0xedbb71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedbc05);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  uVar8 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_331 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedbc5a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,in_stack_fffffffffffff94c))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_368);
    testing::Message::~Message((Message *)0xedbd2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedbdc6);
  Hasher::Hasher(&local_374,1);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_388,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff960),in_RDI,
             (hasher *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
             (key_equal *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff94c,
                                                                   in_stack_fffffffffffff948)))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff944,
                      CONCAT13(in_stack_fffffffffffff943,
                               CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
  uVar9 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_419 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedbe5a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_450);
    testing::Message::~Message((Message *)0xedbf61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedbff5);
  bVar2 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_461 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedc038)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_460);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(in_stack_fffffffffffff944,
                                CONCAT13(in_stack_fffffffffffff943,
                                         CONCAT12(in_stack_fffffffffffff942,
                                                  in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_498);
    testing::Message::~Message((Message *)0xedc10d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedc1a4);
  vVar13 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                          in_stack_fffffffffffff92c);
  local_49c = vVar13;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  uVar10 = google::
           BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                        (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_4d9 = uVar10;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedc224)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(in_stack_fffffffffffff942,
                                                                in_stack_fffffffffffff940))));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_510);
    testing::Message::~Message((Message *)0xedc2f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedc38d);
  uVar11 = google::
           BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                        (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_521 = ~uVar11 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedc3d0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff940))))
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_558);
    testing::Message::~Message((Message *)0xedc4a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedc53c);
  local_55c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  local_599 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xedc5bc)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff940))))
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0xedc691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedc725);
  for (local_5d4 = 3; local_5d4 < 0x7d1; local_5d4 = local_5d4 + 1) {
    in_stack_fffffffffffff934 =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                        in_stack_fffffffffffff92c);
    local_5d8 = in_stack_fffffffffffff934;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  }
  for (local_604 = 2000; type = (Type)(in_RDI >> 0x20), 2 < local_604; local_604 = local_604 + -1) {
    in_stack_fffffffffffff930 =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                        in_stack_fffffffffffff92c);
    local_608 = in_stack_fffffffffffff930;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  }
  bVar2 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (bool *)CONCAT44(CONCAT13(bVar2,(int3)in_stack_fffffffffffff92c),
                              in_stack_fffffffffffff928),(type *)0xedc851);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff960),type,
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff940))))
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_678);
    testing::Message::~Message((Message *)0xedc90b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedc999);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xedc9a6);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_388);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xedc9c0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xedc9cd);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}